

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O1

bool __thiscall TTD::ExecutionInfoManager::IsFinalSourceLine(ExecutionInfoManager *this)

{
  uint startOffset;
  SingleCallCounter *pSVar1;
  bool bVar2;
  ULONG local_30;
  uint32 local_2c;
  ULONG srcLine;
  LONG srcColumn;
  
  pSVar1 = GetTopCallCounter(this);
  bVar2 = false;
  if ((((this->m_innerloopLastLocation).m_eventTime == this->m_topLevelCallbackEventTime) &&
      (bVar2 = false, (this->m_innerloopLastLocation).m_functionTime == pSVar1->FunctionTime)) &&
     ((this->m_innerloopLastLocation).m_loopTime == pSVar1->LoopTime)) {
    local_30 = 0;
    local_2c = 0xffffffff;
    startOffset = Js::FunctionBody::GetStatementStartOffset
                            (pSVar1->Function,pSVar1->CurrentStatementIndex);
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD
              (pSVar1->Function,startOffset,&local_30,(LONG *)&local_2c);
    bVar2 = (this->m_innerloopLastLocation).m_column == local_2c &&
            (this->m_innerloopLastLocation).m_line == local_30;
  }
  return bVar2;
}

Assistant:

bool ExecutionInfoManager::IsFinalSourceLine() const
    {
        const SingleCallCounter& cfinfo = this->GetTopCallCounter();

        if(!this->m_innerloopLastLocation.CheckLastTimeMatch(this->m_topLevelCallbackEventTime, cfinfo.FunctionTime, cfinfo.LoopTime))
        {
            return false;
        }

        ULONG srcLine = 0;
        LONG srcColumn = -1;
        uint32 startOffset = cfinfo.Function->GetStatementStartOffset(cfinfo.CurrentStatementIndex);
        cfinfo.Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);
        return this->m_innerloopLastLocation.CheckLineColumnMatch((uint32) srcLine, (uint32)srcColumn);
    }